

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O0

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::CheckObjs(SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            *this,SolCheck *chk)

{
  Violation viol;
  ModelType *this_00;
  ArrayRef<double> *pAVar1;
  double dVar2;
  unsigned_long *puVar3;
  double *pdVar4;
  size_type __n;
  SolCheck *in_RSI;
  double in_RDI;
  char *nm;
  double val1;
  unsigned_long i;
  ObjList *objs;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffffb8;
  QuadraticObjective *in_stack_ffffffffffffffc0;
  QuadraticObjective *pQVar5;
  size_type local_28;
  unsigned_long local_20;
  ObjList *local_18;
  SolCheck *local_10;
  
  local_10 = in_RSI;
  this_00 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::GetModel((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        *)((long)in_RDI + -0x250));
  local_18 = FlatModel<mp::DefaultFlatModelParams>::get_objectives(this_00);
  local_28 = std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::size
                       (local_18);
  pAVar1 = SolCheck::obj_vals(local_10);
  dVar2 = (double)ArrayRef<double>::size(pAVar1);
  puVar3 = std::min<unsigned_long>(&local_28,(unsigned_long *)&stack0xffffffffffffffd0);
  local_20 = *puVar3;
  while (__n = local_20 - 1, local_20 != 0) {
    local_20 = __n;
    std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::operator[]
              (local_18,__n);
    SolCheck::x_ext(local_10);
    in_stack_ffffffffffffffc0 =
         (QuadraticObjective *)
         mp::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                   (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    SolCheck::ObjViols(local_10);
    pAVar1 = SolCheck::obj_vals(local_10);
    pdVar4 = ArrayRef<double>::operator[](pAVar1,local_20);
    in_stack_ffffffffffffffb8 =
         (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)
         ABS(*pdVar4 - (double)in_stack_ffffffffffffffc0);
    pQVar5 = in_stack_ffffffffffffffc0;
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::sol_feas_tol((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)((long)in_RDI + -0x250));
    nm = (char *)FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 ::sol_feas_tol_rel((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                     *)((long)in_RDI + -0x250));
    std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::operator[]
              (local_18,local_20);
    LinearObjective::name((LinearObjective *)0x15fe5c);
    viol.valX_ = dVar2;
    viol.viol_ = (double)pQVar5;
    ViolSummary::CheckViol
              ((ViolSummary *)in_stack_ffffffffffffffc0,viol,(double)in_stack_ffffffffffffffb8,
               in_RDI,nm);
  }
  return;
}

Assistant:

void CheckObjs(SolCheck& chk) {
    const auto& objs = MPCD( GetModel() ).get_objectives();
    // Solvers might have dummy obj.
    // Unbounded problems might have no obj value.
    for (auto i
         =std::min(objs.size(), chk.obj_vals().size());
         i--; ) {
      auto val1 = ComputeValue(objs[i], chk.x_ext());
      chk.ObjViols().CheckViol(
            {std::fabs(chk.obj_vals()[i] - val1), val1},
            MPCD( sol_feas_tol() ), MPCD( sol_feas_tol_rel() ),
            objs[i].name());
    }
  }